

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.c
# Opt level: O3

void WebRtcIsac_Time2Spec
               (TransformTables *tables,double *inre1,double *inre2,int16_t *outreQ7,
               int16_t *outimQ7,FFTstr *fftstr_obj)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  int dims [1];
  double tmpim [240];
  double tmpre [240];
  int local_f54;
  double local_f50;
  double local_f48;
  double local_f40;
  double local_f38;
  undefined8 uStack_f30;
  double local_f28 [480];
  
  local_f54 = 0xf0;
  lVar10 = 0;
  do {
    pdVar1 = (double *)((long)tables->costab1 + lVar10);
    dVar2 = *pdVar1;
    dVar3 = pdVar1[1];
    pdVar1 = (double *)((long)tables->sintab1 + lVar10);
    dVar4 = *pdVar1;
    dVar5 = pdVar1[1];
    dVar6 = *(double *)((long)inre1 + lVar10);
    dVar7 = ((double *)((long)inre1 + lVar10))[1];
    dVar8 = *(double *)((long)inre2 + lVar10);
    dVar9 = ((double *)((long)inre2 + lVar10))[1];
    *(double *)((long)local_f28 + lVar10 + 0x780) =
         (dVar6 * dVar2 + dVar4 * dVar8) * 0.03227486121839514;
    *(double *)((long)local_f28 + lVar10 + 0x788) =
         (dVar7 * dVar3 + dVar5 * dVar9) * 0.03227486121839514;
    *(double *)((long)local_f28 + lVar10) = (dVar8 * dVar2 - dVar4 * dVar6) * 0.03227486121839514;
    *(double *)((long)local_f28 + lVar10 + 8) =
         (dVar9 * dVar3 - dVar5 * dVar7) * 0.03227486121839514;
    lVar10 = lVar10 + 0x10;
  } while (lVar10 != 0x780);
  WebRtcIsac_Fftns(1,&local_f54,local_f28 + 0xf0,local_f28,-1,1.0,fftstr_obj);
  lVar10 = 0x1de;
  lVar12 = 0;
  do {
    dVar2 = *(double *)((long)local_f28 + lVar12 * 4 + 0x780);
    local_f50 = *(double *)((long)local_f28 + lVar10 * 4 + 0x780);
    local_f40 = dVar2 + local_f50;
    local_f50 = local_f50 - dVar2;
    local_f38 = *(double *)((long)local_f28 + lVar12 * 4);
    dVar2 = *(double *)((long)local_f28 + lVar10 * 4);
    local_f48 = local_f38 - dVar2;
    local_f38 = local_f38 + dVar2;
    uStack_f30 = 0;
    dVar2 = *(double *)((long)tables->costab2 + lVar12 * 4);
    dVar3 = *(double *)((long)tables->sintab2 + lVar12 * 4);
    lVar11 = lrint((local_f40 * dVar2 - dVar3 * local_f48) * 128.0);
    *(short *)((long)outreQ7 + lVar12) = (short)lVar11;
    lVar11 = lrint((local_f40 * dVar3 + local_f48 * dVar2) * 128.0);
    *(short *)((long)outimQ7 + lVar12) = (short)lVar11;
    lVar11 = lrint((-local_f38 * dVar3 - dVar2 * local_f50) * 128.0);
    *(short *)((long)outreQ7 + lVar10) = (short)lVar11;
    lVar11 = lrint((local_f50 * dVar3 - local_f38 * dVar2) * 128.0);
    *(short *)((long)outimQ7 + lVar10) = (short)lVar11;
    lVar10 = lVar10 + -2;
    lVar12 = lVar12 + 2;
  } while (lVar12 != 0xf0);
  return;
}

Assistant:

void WebRtcIsac_Time2Spec(const TransformTables* tables,
                          double* inre1,
                          double* inre2,
                          int16_t* outreQ7,
                          int16_t* outimQ7,
                          FFTstr* fftstr_obj) {
  int k;
  int dims[1];
  double tmp1r, tmp1i, xr, xi, yr, yi, fact;
  double tmpre[FRAMESAMPLES_HALF], tmpim[FRAMESAMPLES_HALF];


  dims[0] = FRAMESAMPLES_HALF;


  /* Multiply with complex exponentials and combine into one complex vector */
  fact = 0.5 / sqrt(FRAMESAMPLES_HALF);
  for (k = 0; k < FRAMESAMPLES_HALF; k++) {
    tmp1r = tables->costab1[k];
    tmp1i = tables->sintab1[k];
    tmpre[k] = (inre1[k] * tmp1r + inre2[k] * tmp1i) * fact;
    tmpim[k] = (inre2[k] * tmp1r - inre1[k] * tmp1i) * fact;
  }


  /* Get DFT */
  WebRtcIsac_Fftns(1, dims, tmpre, tmpim, -1, 1.0, fftstr_obj);

  /* Use symmetry to separate into two complex vectors and center frames in time around zero */
  for (k = 0; k < FRAMESAMPLES_QUARTER; k++) {
    xr = tmpre[k] + tmpre[FRAMESAMPLES_HALF - 1 - k];
    yi = -tmpre[k] + tmpre[FRAMESAMPLES_HALF - 1 - k];
    xi = tmpim[k] - tmpim[FRAMESAMPLES_HALF - 1 - k];
    yr = tmpim[k] + tmpim[FRAMESAMPLES_HALF - 1 - k];

    tmp1r = tables->costab2[k];
    tmp1i = tables->sintab2[k];
    outreQ7[k] = (int16_t)WebRtcIsac_lrint((xr * tmp1r - xi * tmp1i) * 128.0);
    outimQ7[k] = (int16_t)WebRtcIsac_lrint((xr * tmp1i + xi * tmp1r) * 128.0);
    outreQ7[FRAMESAMPLES_HALF - 1 - k] = (int16_t)WebRtcIsac_lrint((-yr * tmp1i - yi * tmp1r) * 128.0);
    outimQ7[FRAMESAMPLES_HALF - 1 - k] = (int16_t)WebRtcIsac_lrint((-yr * tmp1r + yi * tmp1i) * 128.0);
  }
}